

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

void __thiscall
CLI::RequiresError::RequiresError(RequiresError *this,string *curname,string *subname)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pcVar1 = (curname->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + curname->_M_string_length);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_60," requires ");
  pbVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_60,(subname->_M_dataplus)._M_p,subname->_M_string_length);
  local_40._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar3) {
    local_40.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_40._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  RequiresError(this,&local_40,RequiresError);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}